

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error
Qiniu_Qetag_AllocateBlock(_Qiniu_Qetag_Context *ctx,_Qiniu_Qetag_Block **blk,size_t *remainderSize)

{
  Qiniu_Error QVar1;
  size_t *remainderSize_local;
  _Qiniu_Qetag_Block **blk_local;
  _Qiniu_Qetag_Context *ctx_local;
  Qiniu_Error err;
  
  if (ctx->blk == (Qiniu_Qetag_Block *)0x0) {
    QVar1 = Qiniu_Qetag_allocateBlock(ctx,blk);
    err._0_8_ = QVar1.message;
    ctx_local = (_Qiniu_Qetag_Context *)(ulong)(uint)QVar1.code;
    if (QVar1.code != 200) goto LAB_0011bc3f;
  }
  else {
    *blk = ctx->blk;
    ctx->blk = (Qiniu_Qetag_Block *)0x0;
  }
  if (remainderSize != (size_t *)0x0) {
    *remainderSize = (ulong)((uint)(*blk)->field_0 & 0x7fffff);
  }
  ctx_local = (_Qiniu_Qetag_Context *)0xc8;
  err._0_8_ = anon_var_dwarf_bac7;
LAB_0011bc3f:
  QVar1.message = (char *)err._0_8_;
  QVar1._0_8_ = ctx_local;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Qetag_AllocateBlock(struct _Qiniu_Qetag_Context * ctx, struct _Qiniu_Qetag_Block ** blk, size_t * remainderSize)
{
    Qiniu_Error err;

    if (ctx->blk) {
        *blk = ctx->blk;
        ctx->blk = NULL;
    } else {
        err = Qiniu_Qetag_allocateBlock(ctx, blk);
        if (err.code != 200) {
            return err;
        }
    } // if

    if (remainderSize) {
        *remainderSize = (*blk)->capacity;
    }
    err.code = 200;
    err.message = "ok";
    return err;
}